

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::_filter_plain_scalar(Parser *this,substr s,size_t indentation)

{
  char cVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  undefined7 extraout_var;
  size_t num_characters_needed;
  basic_substring<char> dst;
  csubstr cVar7;
  ro_substr chars;
  size_t pos;
  ulong local_d0;
  char msg [42];
  char *pcStack_78;
  size_t local_70;
  char *pcStack_50;
  size_t local_48;
  substr s_local;
  
  s_local.len = s.len;
  s_local.str = s.str;
  chars.len = 2;
  chars.str = " \t";
  dst = basic_substring<char>::triml(&s_local,chars);
  num_characters_needed = dst.len;
  _grow_filter_arena(this,num_characters_needed);
  pos = 0;
  msg._0_8_ = 0;
  local_d0 = 0;
  do {
    if (num_characters_needed <= (ulong)msg._0_8_) {
      if ((this->m_filter_arena).len < pos) {
        builtin_strncpy(msg,"check failed: (pos <= m_filter_arena.len)",0x2a);
        if (((byte)s_error_flags & 1) != 0) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar3 = (code *)swi(3);
            cVar7 = (csubstr)(*pcVar3)();
            return cVar7;
          }
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar7 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
        local_48 = cVar7.len;
        pcStack_50 = cVar7.str;
        LVar4.super_LineCol.col = 0;
        LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7c36) << 0x40,0);
        LVar4.super_LineCol.line = SUB168(ZEXT816(0x7c36) << 0x40,8);
        LVar4.name.str = pcStack_50;
        LVar4.name.len = local_48;
        (*p_Var2)(msg,0x2a,LVar4,(this->m_stack).m_callbacks.m_user_data);
      }
      if (pos < num_characters_needed || (local_d0 & 1) != 0) {
        dst = _finish_filter_arena(this,dst,pos);
      }
      if (s_local.len < dst.len) {
        builtin_strncpy(msg,"check failed: (s.len >= r.len)",0x1f);
        if (((byte)s_error_flags & 1) != 0) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar3 = (code *)swi(3);
            cVar7 = (csubstr)(*pcVar3)();
            return cVar7;
          }
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar7 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
        local_70 = cVar7.len;
        pcStack_78 = cVar7.str;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7c3c) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x7c3c) << 0x40,8);
        LVar5.name.str = pcStack_78;
        LVar5.name.len = local_70;
        (*p_Var2)(msg,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
      }
      cVar7.str = dst.str;
      cVar7.len = dst.len;
      return cVar7;
    }
    cVar1 = dst.str[msg._0_8_];
    if (cVar1 == ' ') {
LAB_001d2a6b:
      _filter_ws<false>(this,dst,(size_t *)msg,&pos);
    }
    else if (cVar1 == '\n') {
      bVar6 = _filter_nl<false,false>(this,dst,(size_t *)msg,&pos,indentation);
      local_d0 = CONCAT71(extraout_var,bVar6);
    }
    else if (cVar1 != '\r') {
      if (cVar1 == '\t') goto LAB_001d2a6b;
      (this->m_filter_arena).str[pos] = cVar1;
      pos = pos + 1;
    }
    msg._0_8_ = msg._0_8_ + 1;
  } while( true );
}

Assistant:

csubstr Parser::_filter_plain_scalar(substr s, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfps(...) _c4dbgpf("filt_plain_scalar" __VA_ARGS__)
    #else
    #define _c4dbgfps(...)
    #endif

    _c4dbgfps("before=~~~{}~~~", s);

    substr r = s.triml(" \t");
    _grow_filter_arena(r.len);
    size_t pos = 0; // the filtered size
    bool filtered_chars = false;
    for(size_t i = 0; i < r.len; ++i)
    {
        const char curr = r.str[i];
        _c4dbgfps("[{}]: '{}'", i, _c4prc(curr));
        if(curr == ' ' || curr == '\t')
        {
            _filter_ws</*keep_trailing_ws*/false>(r, &i, &pos);
        }
        else if(curr == '\n')
        {
            filtered_chars = _filter_nl</*backslash_is_escape*/false, /*keep_trailing_ws*/false>(r, &i, &pos, indentation);
        }
        else if(curr == '\r')  // skip \r --- https://stackoverflow.com/questions/1885900
        {
            ;
        }
        else
        {
            m_filter_arena.str[pos++] = r[i];
        }
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    if(pos < r.len || filtered_chars)
    {
        r = _finish_filter_arena(r, pos);
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= r.len);
    _c4dbgfps("#filteredchars={} after=~~~{}~~~", s.len - r.len, r);

    #undef _c4dbgfps
    return r;
}